

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::ScanLineInputFile::initialize(ScanLineInputFile *this,Header *header)

{
  int iVar1;
  LineOrder *pLVar2;
  Box2i *pBVar3;
  size_t maxScanLineSize;
  InputExc *this_00;
  LineBuffer *pLVar4;
  reference ppLVar5;
  ulong uVar6;
  Compressor *pCVar7;
  long in_RDI;
  int lineOffsetSize;
  size_t i_1;
  size_t i;
  size_t maxBytesPerLine;
  Box2i *dataWindow;
  char *in_stack_ffffffffffffff78;
  Compressor *in_stack_ffffffffffffff80;
  Compressor *in_stack_ffffffffffffff88;
  value_type in_stack_ffffffffffffff90;
  Compressor *in_stack_ffffffffffffff98;
  Compressor *local_40;
  Header *in_stack_ffffffffffffffd8;
  LineBuffer *this_01;
  LineBuffer *hdr;
  Header *in_stack_ffffffffffffffe0;
  
  Header::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pLVar2 = Header::lineOrder((Header *)0x1a4005);
  *(LineOrder *)(*(long *)(in_RDI + 8) + 0x98) = *pLVar2;
  pBVar3 = Header::dataWindow((Header *)0x1a4026);
  *(int *)(*(long *)(in_RDI + 8) + 0x9c) = (pBVar3->min).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xa0) = (pBVar3->max).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xa4) = (pBVar3->min).y;
  *(int *)(*(long *)(in_RDI + 8) + 0xa8) = (pBVar3->max).y;
  maxScanLineSize =
       bytesPerLineTable(in_stack_ffffffffffffffe0,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_ffffffffffffffd8);
  if (maxScanLineSize < 0x80000000) {
    this_01 = (LineBuffer *)0x0;
    while (hdr = this_01,
          pLVar4 = (LineBuffer *)
                   std::
                   vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                   ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                           *)(*(long *)(in_RDI + 8) + 0x118)), this_01 < pLVar4) {
      in_stack_ffffffffffffff90 = (value_type)operator_new(0x80);
      in_stack_ffffffffffffff98 = (Compressor *)Header::compression((Header *)0x1a4135);
      in_stack_ffffffffffffff88 =
           newCompressor((Compression)((ulong)pBVar3 >> 0x20),maxScanLineSize,(Header *)hdr);
      anon_unknown_6::LineBuffer::LineBuffer(this_01,in_stack_ffffffffffffff98);
      ppLVar5 = std::
                vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                              *)(*(long *)(in_RDI + 8) + 0x118),(size_type)hdr);
      *ppLVar5 = in_stack_ffffffffffffff90;
      this_01 = (LineBuffer *)((long)&(hdr->buffer)._size + 1);
    }
    std::
    vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
    ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  *)(*(long *)(in_RDI + 8) + 0x118),0);
    iVar1 = numLinesInBuffer(in_stack_ffffffffffffff80);
    *(int *)(*(long *)(in_RDI + 8) + 0x130) = iVar1;
    *(size_t *)(*(long *)(in_RDI + 8) + 0x138) =
         maxScanLineSize * (long)*(int *)(*(long *)(in_RDI + 8) + 0x130);
    uVar6 = (**(code **)(**(long **)(*(long *)(in_RDI + 0x10) + 0x28) + 0x10))();
    iVar1 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    if ((uVar6 & 1) == 0) {
      local_40 = (Compressor *)0x0;
      while( true ) {
        in_stack_ffffffffffffff80 = local_40;
        pCVar7 = (Compressor *)
                 std::
                 vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                         *)(*(long *)(in_RDI + 8) + 0x118));
        iVar1 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        if (pCVar7 <= in_stack_ffffffffffffff80) break;
        in_stack_ffffffffffffff78 =
             (char *)EXRAllocAligned((size_t)in_stack_ffffffffffffff80,
                                     (size_t)in_stack_ffffffffffffff78);
        ppLVar5 = std::
                  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                *)(*(long *)(in_RDI + 8) + 0x118),(size_type)local_40);
        ((*ppLVar5)->buffer)._data = in_stack_ffffffffffffff78;
        local_40 = (Compressor *)((long)&local_40->_vptr_Compressor + 1);
      }
    }
    *(int *)(*(long *)(in_RDI + 8) + 0xcc) = *(int *)(*(long *)(in_RDI + 8) + 0xa4) + -1;
    offsetInLineBufferTable
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff90,
               iVar1,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffff80);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,
               (size_type)in_stack_ffffffffffffff98);
    return;
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this_00,"maximum bytes per scanline exceeds maximum permissible size")
  ;
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void ScanLineInputFile::initialize(const Header& header)
{
        _data->header = header;

        _data->lineOrder = _data->header.lineOrder();

        const Box2i &dataWindow = _data->header.dataWindow();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        size_t maxBytesPerLine = bytesPerLineTable (_data->header,
                                                    _data->bytesPerLine);
        
        if(maxBytesPerLine > INT_MAX)
        {
            throw IEX_NAMESPACE::InputExc("maximum bytes per scanline exceeds maximum permissible size");
        }


        for (size_t i = 0; i < _data->lineBuffers.size(); i++)
        {
            _data->lineBuffers[i] = new LineBuffer (newCompressor
                                                (_data->header.compression(),
                                                 maxBytesPerLine,
                                                 _data->header));
        }

        _data->linesInBuffer =
            numLinesInBuffer (_data->lineBuffers[0]->compressor);

        _data->lineBufferSize = maxBytesPerLine * _data->linesInBuffer;

        if (!_streamData->is->isMemoryMapped())
        {
            for (size_t i = 0; i < _data->lineBuffers.size(); i++)
            {
                _data->lineBuffers[i]->buffer = (char *) EXRAllocAligned(_data->lineBufferSize*sizeof(char),16);
            }
        }
        _data->nextLineBufferMinY = _data->minY - 1;

        offsetInLineBufferTable (_data->bytesPerLine,
                                 _data->linesInBuffer,
                                 _data->offsetInLineBuffer);

        int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
                              _data->linesInBuffer) / _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);
}